

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

int evsig_restore_handler_(event_base *base,int evsignal)

{
  sigaction *__act;
  int iVar1;
  sigaction *sh;
  evsig_info *sig;
  int ret;
  int evsignal_local;
  event_base *base_local;
  
  sig._0_4_ = 0;
  if (evsignal < (base->sig).sh_old_max) {
    __act = (base->sig).sh_old[evsignal];
    (base->sig).sh_old[evsignal] = (sigaction *)0x0;
    iVar1 = sigaction(evsignal,(sigaction *)__act,(sigaction *)0x0);
    if (iVar1 == -1) {
      event_warn("sigaction");
      sig._0_4_ = -1;
    }
    event_mm_free_(__act);
    base_local._4_4_ = (int)sig;
  }
  else {
    base_local._4_4_ = 0;
  }
  return base_local._4_4_;
}

Assistant:

int
evsig_restore_handler_(struct event_base *base, int evsignal)
{
	int ret = 0;
	struct evsig_info *sig = &base->sig;
#ifdef EVENT__HAVE_SIGACTION
	struct sigaction *sh;
#else
	ev_sighandler_t *sh;
#endif

	if (evsignal >= sig->sh_old_max) {
		/* Can't actually restore. */
		/* XXXX.*/
		return 0;
	}

	/* restore previous handler */
	sh = sig->sh_old[evsignal];
	sig->sh_old[evsignal] = NULL;
#ifdef EVENT__HAVE_SIGACTION
	if (sigaction(evsignal, sh, NULL) == -1) {
		event_warn("sigaction");
		ret = -1;
	}
#else
	if (signal(evsignal, *sh) == SIG_ERR) {
		event_warn("signal");
		ret = -1;
	}
#endif

	mm_free(sh);

	return ret;
}